

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
TxConfirmStats::Read(TxConfirmStats *this,AutoFile *filein,int nFileVersion,size_t numBuckets)

{
  long lVar1;
  ConstevalFormatString<2U> fmt;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  runtime_error *prVar3;
  size_type sVar4;
  ulong uVar5;
  size_type sVar6;
  size_type sVar7;
  size_type in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  unsigned_long *in_stack_00000070;
  unsigned_long *in_stack_00000078;
  uint i_1;
  uint i;
  size_t maxPeriods;
  size_t maxConfirms;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  AutoFile *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  TxConfirmStats *in_stack_fffffffffffffed8;
  LogFlags in_stack_ffffffffffffff20;
  int source_line;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar8;
  uint uVar9;
  undefined1 in_stack_ffffffffffffff74 [12];
  undefined4 in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<(anonymous_namespace)::EncodedDoubleFormatter,double&>((double *)in_stack_fffffffffffffec0);
  AutoFile::operator>>
            (in_stack_fffffffffffffec8,
             (Wrapper<(anonymous_namespace)::EncodedDoubleFormatter,_double_&> *)
             in_stack_fffffffffffffec0);
  if ((*(double *)(in_RDI + 0x70) <= 0.0) || (1.0 <= *(double *)(in_RDI + 0x70))) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    AutoFile::operator>>(in_stack_fffffffffffffec8,(uint *)in_stack_fffffffffffffec0);
    if (*(int *)(in_RDI + 0x78) == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Corrupt estimates file. Scale must be non-zero");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      Using<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,std::vector<double,std::allocator<double>>&>
                (in_stack_fffffffffffffec0);
      AutoFile::operator>>
                (in_stack_fffffffffffffec8,
                 (Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
                  *)in_stack_fffffffffffffec0);
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (sVar4 == in_RCX) {
        Using<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,std::vector<double,std::allocator<double>>&>
                  (in_stack_fffffffffffffec0);
        AutoFile::operator>>
                  (in_stack_fffffffffffffec8,
                   (Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
                    *)in_stack_fffffffffffffec0);
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        if (sVar4 == in_RCX) {
          Using<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&>
                    ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffec0);
          AutoFile::operator>>
                    (in_stack_fffffffffffffec8,
                     (Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                      *)in_stack_fffffffffffffec0);
          sVar4 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          uVar5 = *(uint *)(in_RDI + 0x78) * sVar4;
          if ((uVar5 == 0) || (0x3f0 < uVar5)) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar3,
                       "Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            for (uVar9 = 0; uVar9 < sVar4; uVar9 = uVar9 + 1) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0);
              sVar6 = std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
              if (sVar6 != in_RCX) {
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar3,
                           "Corrupt estimates file. Mismatch in feerate conf average bucket count");
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_004f067f;
              }
            }
            Using<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&>
                      ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_stack_fffffffffffffec0);
            AutoFile::operator>>
                      (in_stack_fffffffffffffec8,
                       (Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                        *)in_stack_fffffffffffffec0);
            sVar6 = sVar4;
            sVar7 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            if (sVar4 == sVar7) {
              for (uVar8 = 0; source_line = (int)((ulong)in_RSI >> 0x20), uVar8 < sVar6;
                  uVar8 = uVar8 + 1) {
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0);
                sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
                if (sVar4 != in_RCX) {
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar3,
                             "Corrupt estimates file. Mismatch in one of failure average bucket counts"
                            );
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                    __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_004f067f;
                }
              }
              resizeInMemoryCounters(in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
              bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),Trace);
              if (bVar2) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                logging_function._M_str._0_4_ = in_stack_ffffffffffffff88;
                logging_function._M_len = sVar6;
                logging_function._M_str._4_4_ = in_EDX;
                source_file._4_12_ = in_stack_ffffffffffffff74;
                source_file._M_len._0_4_ = uVar9;
                fmt.fmt._4_4_ = uVar8;
                fmt.fmt._0_4_ = in_stack_ffffffffffffff68;
                LogPrintFormatInternal<unsigned_long,unsigned_long>
                          (logging_function,source_file,source_line,in_stack_ffffffffffffff20,
                           in_stack_00000060,fmt,in_stack_00000070,in_stack_00000078);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                return;
              }
            }
            else {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar3,"Corrupt estimates file. Mismatch in confirms tracked for failures")
              ;
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
          }
        }
        else {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,"Corrupt estimates file. Mismatch in tx count bucket count");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,"Corrupt estimates file. Mismatch in feerate average bucket count");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
LAB_004f067f:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Read(AutoFile& filein, int nFileVersion, size_t numBuckets)
{
    // Read data file and do some very basic sanity checking
    // buckets and bucketMap are not updated yet, so don't access them
    // If there is a read failure, we'll just discard this entire object anyway
    size_t maxConfirms, maxPeriods;

    // The current version will store the decay with each individual TxConfirmStats and also keep a scale factor
    filein >> Using<EncodedDoubleFormatter>(decay);
    if (decay <= 0 || decay >= 1) {
        throw std::runtime_error("Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    }
    filein >> scale;
    if (scale == 0) {
        throw std::runtime_error("Corrupt estimates file. Scale must be non-zero");
    }

    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(m_feerate_avg);
    if (m_feerate_avg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in feerate average bucket count");
    }
    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(txCtAvg);
    if (txCtAvg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in tx count bucket count");
    }
    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(confAvg);
    maxPeriods = confAvg.size();
    maxConfirms = scale * maxPeriods;

    if (maxConfirms <= 0 || maxConfirms > 6 * 24 * 7) { // one week
        throw std::runtime_error("Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (confAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in feerate conf average bucket count");
        }
    }

    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(failAvg);
    if (maxPeriods != failAvg.size()) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in confirms tracked for failures");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (failAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in one of failure average bucket counts");
        }
    }

    // Resize the current block variables which aren't stored in the data file
    // to match the number of confirms and buckets
    resizeInMemoryCounters(numBuckets);

    LogDebug(BCLog::ESTIMATEFEE, "Reading estimates: %u buckets counting confirms up to %u blocks\n",
             numBuckets, maxConfirms);
}